

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_GetAvailableFrames
                  (PaAlsaStream *self,int queryCapture,int queryPlayback,unsigned_long *available,
                  int *xrunOccurred)

{
  ulong local_48;
  ulong local_40;
  unsigned_long playbackFrames;
  unsigned_long captureFrames;
  int *piStack_28;
  PaError result;
  int *xrunOccurred_local;
  unsigned_long *available_local;
  int queryPlayback_local;
  int queryCapture_local;
  PaAlsaStream *self_local;
  
  captureFrames._4_4_ = 0;
  *xrunOccurred = 0;
  piStack_28 = xrunOccurred;
  xrunOccurred_local = (int *)available;
  available_local._0_4_ = queryPlayback;
  available_local._4_4_ = queryCapture;
  _queryPlayback_local = self;
  if ((queryCapture == 0) && (queryPlayback == 0)) {
    __assert_fail("queryCapture || queryPlayback",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0xe77,
                  "PaError PaAlsaStream_GetAvailableFrames(PaAlsaStream *, int, int, unsigned long *, int *)"
                 );
  }
  if (queryCapture != 0) {
    if ((self->capture).pcm == (snd_pcm_t *)0x0) {
      __assert_fail("self->capture.pcm",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0xe7b,
                    "PaError PaAlsaStream_GetAvailableFrames(PaAlsaStream *, int, int, unsigned long *, int *)"
                   );
    }
    paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                           (&self->capture,&playbackFrames,xrunOccurred);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &self->capture, &captureFrames, xrunOccurred )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3708\n"
                       );
      return paUtilErr_;
    }
    if (*piStack_28 != 0) {
      return captureFrames._4_4_;
    }
  }
  if ((int)available_local != 0) {
    if ((_queryPlayback_local->playback).pcm == (snd_pcm_t *)0x0) {
      __assert_fail("self->playback.pcm",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0xe84,
                    "PaError PaAlsaStream_GetAvailableFrames(PaAlsaStream *, int, int, unsigned long *, int *)"
                   );
    }
    paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                           (&_queryPlayback_local->playback,&local_40,piStack_28);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &self->playback, &playbackFrames, xrunOccurred )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3717\n"
                       );
      return paUtilErr_;
    }
    if (*piStack_28 != 0) {
      return captureFrames._4_4_;
    }
  }
  if ((available_local._4_4_ == 0) || ((int)available_local == 0)) {
    if (available_local._4_4_ == 0) {
      *(ulong *)xrunOccurred_local = local_40;
    }
    else {
      *(unsigned_long *)xrunOccurred_local = playbackFrames;
    }
  }
  else {
    if (playbackFrames < local_40) {
      local_48 = playbackFrames;
    }
    else {
      local_48 = local_40;
    }
    *(ulong *)xrunOccurred_local = local_48;
  }
  return captureFrames._4_4_;
}

Assistant:

static PaError PaAlsaStream_GetAvailableFrames( PaAlsaStream *self, int queryCapture, int queryPlayback, unsigned long
        *available, int *xrunOccurred )
{
    PaError result = paNoError;
    unsigned long captureFrames, playbackFrames;
    *xrunOccurred = 0;

    assert( queryCapture || queryPlayback );

    if( queryCapture )
    {
        assert( self->capture.pcm );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &self->capture, &captureFrames, xrunOccurred ) );
        if( *xrunOccurred )
        {
            goto end;
        }
    }
    if( queryPlayback )
    {
        assert( self->playback.pcm );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &self->playback, &playbackFrames, xrunOccurred ) );
        if( *xrunOccurred )
        {
            goto end;
        }
    }

    if( queryCapture && queryPlayback )
    {
        *available = PA_MIN( captureFrames, playbackFrames );
        /*PA_DEBUG(("capture: %lu, playback: %lu, combined: %lu\n", captureFrames, playbackFrames, *available));*/
    }
    else if( queryCapture )
    {
        *available = captureFrames;
    }
    else
    {
        *available = playbackFrames;
    }

end:
error:
    return result;
}